

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  long lVar8;
  longlong lVar9;
  parasail_result_t *ppVar10;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  ulong size;
  long lVar21;
  long lVar22;
  char *__format;
  __m128i *palVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  int32_t segNum;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  longlong lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  longlong lVar40;
  undefined1 auVar41 [16];
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined4 uVar45;
  undefined4 uVar46;
  __m128i_64_t A;
  undefined1 auVar47 [16];
  int64_t iVar48;
  __m128i_64_t B_2;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i_64_t B;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i_64_t B_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar17 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar17 = "profile->profile64.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar17 = "profile->matrix";
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar17 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar17 = "s2";
        }
        else {
          uVar29 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar17 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar17 = "open";
          }
          else {
            if (-1 < gap) {
              uVar20 = uVar18 - 1;
              size = (ulong)uVar18 + 1 >> 1;
              iVar11 = -open;
              iVar14 = ppVar3->min;
              uVar30 = 0x8000000000000000 - (long)iVar14;
              if (iVar14 != iVar11 && SBORROW4(iVar14,iVar11) == iVar14 + open < 0) {
                uVar30 = (ulong)(uint)open | 0x8000000000000000;
              }
              iVar14 = ppVar3->max;
              ppVar10 = parasail_result_new_table1((uint)((ulong)uVar18 + 1) & 0x7ffffffe,s2Len);
              if (ppVar10 != (parasail_result_t *)0x0) {
                ppVar10->flag = ppVar10->flag | 0x2820401;
                ptr = parasail_memalign___m128i(0x10,size);
                ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
                ptr_01 = parasail_memalign___m128i(0x10,size);
                ptr_02 = parasail_memalign___m128i(0x10,size);
                ptr_03 = parasail_memalign___m128i(0x10,size);
                if (ptr_03 != (__m128i *)0x0 &&
                    ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                    (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
                  iVar12 = s2Len + -1;
                  uVar42 = (ulong)(uint)open;
                  lVar15 = uVar30 + 1;
                  lVar21 = 0x7ffffffffffffffe - (long)iVar14;
                  uVar45 = (undefined4)lVar15;
                  uVar46 = (undefined4)((ulong)lVar15 >> 0x20);
                  uVar16 = (ulong)(uint)gap;
                  lVar19 = (long)iVar11;
                  lVar25 = lVar19;
                  for (uVar24 = 0; uVar24 != size; uVar24 = uVar24 + 1) {
                    lVar26 = lVar25;
                    for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
                      *(long *)((long)&h + lVar27 * 8) = lVar26;
                      *(ulong *)((long)&e + lVar27 * 8) = lVar26 - (ulong)(uint)open;
                      lVar26 = lVar26 - size * uVar16;
                    }
                    ptr_02[uVar24][0] = h.m[0];
                    ptr_02[uVar24][1] = h.m[1];
                    ptr[uVar24][0] = e.m[0];
                    ptr[uVar24][1] = e.m[1];
                    lVar25 = lVar25 - uVar16;
                  }
                  *ptr_00 = 0;
                  for (uVar24 = 1; s2Len + 1 != uVar24; uVar24 = uVar24 + 1) {
                    ptr_00[uVar24] = lVar19;
                    lVar19 = lVar19 - uVar16;
                  }
                  lVar25 = -uVar42;
                  uVar16 = (ulong)(uint)open;
                  lVar19 = -uVar16;
                  uVar13 = (int)size - 1;
                  for (uVar18 = uVar13; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
                    ptr_03[uVar18][0] = lVar25;
                    ptr_03[uVar18][1] = lVar19;
                    lVar25 = lVar25 - (ulong)(uint)gap;
                    lVar19 = lVar19 - (ulong)(uint)gap;
                  }
                  palVar23 = ptr_02 + uVar13;
                  lVar26 = 0;
                  uVar24 = 0;
                  auVar59._8_4_ = uVar45;
                  auVar59._0_8_ = lVar15;
                  auVar59._12_4_ = uVar46;
                  lVar25 = lVar21;
                  lVar19 = lVar21;
                  while (uVar24 != uVar29) {
                    auVar49._8_4_ = (int)(*palVar23)[0];
                    auVar49._0_8_ = (*palVar23)[0];
                    auVar49._12_4_ = *(undefined4 *)((long)*palVar23 + 4);
                    iVar14 = ppVar3->mapper[(byte)s2[uVar24]];
                    auVar62._8_4_ = uVar45;
                    auVar62._0_8_ = lVar15;
                    auVar62._12_4_ = uVar46;
                    auVar51._0_8_ = lVar15 - (*ptr_03)[0];
                    auVar51._8_8_ = auVar62._8_8_ - (*ptr_03)[1];
                    lVar28 = 0;
                    auVar58._8_4_ = uVar45;
                    auVar58._0_8_ = lVar15;
                    auVar58._12_4_ = uVar46;
                    iVar48 = ptr_00[uVar24];
                    lVar27 = auVar49._8_8_;
                    while( true ) {
                      lVar22 = auVar58._0_8_;
                      if (size << 4 == lVar28) break;
                      plVar1 = (long *)((long)*ptr_02 + lVar28);
                      lVar7 = *plVar1;
                      lVar8 = plVar1[1];
                      plVar1 = (long *)((long)*ptr + lVar28);
                      auVar60._0_8_ = *plVar1 - (ulong)(uint)gap;
                      auVar60._8_8_ = plVar1[1] - (ulong)(uint)gap;
                      plVar1 = (long *)((long)pvVar2 + lVar28 + (long)(iVar14 * (int)size) * 0x10);
                      auVar50._0_8_ = iVar48 + *plVar1;
                      auVar50._8_8_ = lVar27 + plVar1[1];
                      plVar1 = (long *)((long)*ptr_03 + lVar28);
                      auVar57._0_8_ = auVar51._0_8_ + *plVar1;
                      auVar57._8_8_ = auVar51._8_8_ + plVar1[1];
                      auVar61._0_8_ = lVar7 - uVar42;
                      auVar61._8_8_ = lVar8 - uVar16;
                      auVar32._0_8_ = -(ulong)(auVar57._0_8_ < lVar22);
                      auVar32._8_8_ = -(ulong)(auVar57._8_8_ < auVar58._8_8_);
                      auVar58 = blendvpd(auVar57,auVar58,auVar32);
                      auVar33._0_8_ = -(ulong)(auVar61._0_8_ < auVar60._0_8_);
                      auVar33._8_8_ = -(ulong)(auVar61._8_8_ < auVar60._8_8_);
                      auVar62 = blendvpd(auVar61,auVar60,auVar33);
                      auVar34._0_8_ = -(ulong)(auVar50._0_8_ < auVar62._0_8_);
                      auVar34._8_8_ = -(ulong)(auVar50._8_8_ < auVar62._8_8_);
                      auVar51 = blendvpd(auVar50,auVar62,auVar34);
                      *(undefined1 (*) [16])((long)*ptr + lVar28) = auVar62;
                      *(undefined1 (*) [16])((long)*ptr_01 + lVar28) = auVar51;
                      lVar28 = lVar28 + 0x10;
                      iVar48 = lVar7;
                      lVar27 = lVar8;
                    }
                    auVar55._8_4_ = auVar51._0_4_;
                    auVar55._0_8_ = auVar51._0_8_;
                    auVar55._12_4_ = auVar51._4_4_;
                    lVar27 = ptr_00[uVar24 + 1];
                    uVar24 = uVar24 + 1;
                    auVar56._8_8_ = auVar55._8_8_;
                    auVar56._0_8_ = lVar27;
                    lVar28 = lVar27 + (*ptr_03)[0];
                    if (lVar28 < lVar22) {
                      lVar28 = lVar22;
                    }
                    auVar53._8_8_ = lVar28;
                    auVar53._0_8_ = lVar15;
                    auVar35._0_8_ = -(ulong)(lVar15 < lVar27);
                    auVar35._8_8_ = -(ulong)(lVar28 < auVar56._8_8_);
                    auVar62 = blendvpd(auVar53,auVar56,auVar35);
                    lVar28 = 0;
                    lVar27 = lVar26;
                    while( true ) {
                      if (size << 4 == lVar28) break;
                      auVar54._0_8_ = auVar53._0_8_ - (ulong)(uint)gap;
                      auVar54._8_8_ = auVar53._8_8_ - (ulong)(uint)gap;
                      auVar52._0_8_ = auVar62._0_8_ - uVar42;
                      auVar52._8_8_ = auVar62._8_8_ - uVar16;
                      auVar36._0_8_ = -(ulong)(auVar52._0_8_ < auVar54._0_8_);
                      auVar36._8_8_ = -(ulong)(auVar52._8_8_ < auVar54._8_8_);
                      auVar53 = blendvpd(auVar52,auVar54,auVar36);
                      auVar62 = *(undefined1 (*) [16])((long)*ptr_01 + lVar28);
                      auVar37._0_8_ = -(ulong)(auVar53._0_8_ < auVar62._0_8_);
                      auVar37._8_8_ = -(ulong)(auVar53._8_8_ < auVar62._8_8_);
                      auVar62 = blendvpd(auVar53,auVar62,auVar37);
                      auVar38._0_8_ = -(ulong)(lVar25 < auVar62._0_8_);
                      auVar38._8_8_ = -(ulong)(lVar19 < auVar62._8_8_);
                      auVar5._8_4_ = (int)lVar19;
                      auVar5._0_8_ = lVar25;
                      auVar5._12_4_ = (int)((ulong)lVar19 >> 0x20);
                      auVar58 = blendvpd(auVar62,auVar5,auVar38);
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar28) = auVar62;
                      auVar39._0_8_ = -(ulong)(auVar62._0_8_ < auVar59._0_8_);
                      auVar39._8_8_ = -(ulong)(auVar62._8_8_ < auVar59._8_8_);
                      piVar4 = ((ppVar10->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + lVar27) = auVar62._0_4_;
                      *(int *)((long)piVar4 + size * uVar29 * 4 + lVar27) = auVar62._8_4_;
                      auVar59 = blendvpd(auVar62,auVar59,auVar39);
                      lVar28 = lVar28 + 0x10;
                      lVar27 = lVar27 + uVar29 * 4;
                      lVar25 = auVar58._0_8_;
                      lVar19 = auVar58._8_8_;
                    }
                    lVar26 = lVar26 + 4;
                  }
                  iVar14 = 0;
                  lVar9 = ptr_02[(ulong)uVar20 % size][0];
                  lVar40 = ptr_02[(ulong)uVar20 % size][1];
                  while (lVar31 = lVar9, iVar14 < 1 - (int)(uVar20 / size)) {
                    lVar9 = 0;
                    lVar40 = lVar31;
                    iVar14 = 1;
                  }
                  auVar43._8_4_ = (int)uVar30;
                  auVar43._0_8_ = uVar30;
                  auVar43._12_4_ = (int)(uVar30 >> 0x20);
                  lVar15 = -(ulong)(auVar43._8_8_ < lVar19);
                  auVar44._8_4_ = 0xffffffff;
                  auVar44._0_8_ = 0xffffffffffffffff;
                  auVar44._12_4_ = 0xffffffff;
                  auVar6._8_4_ = (int)lVar15;
                  auVar6._0_8_ = -(ulong)((long)uVar30 < lVar25);
                  auVar6._12_4_ = (int)((ulong)lVar15 >> 0x20);
                  auVar41._8_4_ = (int)lVar21;
                  auVar41._0_8_ = lVar21;
                  auVar41._12_4_ = (int)((ulong)lVar21 >> 0x20);
                  auVar47._0_8_ = -(ulong)(lVar21 < auVar59._0_8_);
                  auVar47._8_8_ = -(ulong)(auVar41._8_8_ < auVar59._8_8_);
                  iVar14 = movmskpd(iVar14,auVar47 | auVar44 ^ auVar6);
                  if (iVar14 == 0) {
                    iVar14 = (int)lVar40;
                  }
                  else {
                    *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                    iVar14 = 0;
                    iVar12 = 0;
                    uVar20 = 0;
                  }
                  ppVar10->score = iVar14;
                  ppVar10->end_query = uVar20;
                  ppVar10->end_ref = iVar12;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  return ppVar10;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar17 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_scan_profile_sse41_128_64",pcVar17);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}